

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoListWnd.cpp
# Opt level: O2

bool InfoListWnd::ToggleDisplay(int _force)

{
  bool bVar1;
  InfoListWnd *this;
  
  if (_force == 0) {
    bVar1 = IsDisplayed();
    if (bVar1) goto LAB_0013868c;
  }
  else if (_force < 1) {
LAB_0013868c:
    if (gpILW != (InfoListWnd *)0x0) {
      (*(gpILW->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[1])();
    }
    return false;
  }
  if (gpILW == (InfoListWnd *)0x0) {
    this = (InfoListWnd *)operator_new(0x300);
    InfoListWnd(this,WND_MODE_FLOAT_CNT_VR);
    gpILW = this;
  }
  (*(gpILW->super_LTImgWindow).super_ImgWindow._vptr_ImgWindow[2])(gpILW,1);
  ImgWindow::BringWindowToFront((ImgWindow *)gpILW);
  return true;
}

Assistant:

bool InfoListWnd::ToggleDisplay (int _force)
{
    // If we toggle then do what current is not the state
    if (!_force)
        _force = InfoListWnd::IsDisplayed() ? -1 : 1;
    
    // Open the window?
    if (_force > 0)
    {
        // Create the object and window if needed
        if (!gpILW)
            gpILW = new InfoListWnd();
        // Ensure it is visible
        gpILW->SetVisible(true);
        gpILW->BringWindowToFront();
        return true;                    // visible now
    }
    // Close the window
    else
    {
        if (gpILW)                      // just remove the object
            delete gpILW;               // (destructor clears gpILW)
        return false;                   // not visible
    }
}